

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O3

void google::protobuf::util::anon_unknown_0::ConvertEnumDescriptor
               (EnumDescriptor *descriptor,Enum *enum_type)

{
  EnumValueDescriptor *pEVar1;
  Edition EVar2;
  SourceContext *pSVar3;
  void *pvVar4;
  int iVar5;
  Arena *pAVar6;
  long lVar7;
  long lVar8;
  
  Enum::Clear(enum_type);
  EVar2 = FileDescriptor::edition(descriptor->file_);
  iVar5 = 0;
  if (EVar2 != EDITION_PROTO2) {
    iVar5 = (EVar2 != EDITION_PROTO3) + 1;
  }
  (enum_type->field_0)._impl_.syntax_ = iVar5;
  pAVar6 = (Arena *)(enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(enum_type->field_0)._impl_.name_,descriptor->all_names_ + 1,pAVar6);
  *(byte *)&enum_type->field_0 = *(byte *)&enum_type->field_0 | 1;
  pSVar3 = (enum_type->field_0)._impl_.source_context_;
  if (pSVar3 == (SourceContext *)0x0) {
    pAVar6 = (Arena *)(enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    pSVar3 = (SourceContext *)Arena::DefaultConstruct<google::protobuf::SourceContext>(pAVar6);
    (enum_type->field_0)._impl_.source_context_ = pSVar3;
  }
  pAVar6 = (Arena *)(pSVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(pSVar3->field_0)._impl_.file_name_,descriptor->file_->name_,pAVar6);
  if (0 < descriptor->value_count_) {
    lVar8 = 4;
    lVar7 = 0;
    do {
      pEVar1 = descriptor->values_;
      pvVar4 = internal::RepeatedPtrFieldBase::AddMessageLite
                         (&(enum_type->field_0)._impl_.enumvalue_.super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<google::protobuf::EnumValue>);
      pAVar6 = *(Arena **)((long)pvVar4 + 8);
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)((long)pvVar4 + 0x28),
                 *(string **)((long)&pEVar1->number_ + lVar8),pAVar6);
      *(undefined4 *)((long)pvVar4 + 0x30) = *(undefined4 *)(&pEVar1->super_SymbolBaseN<0> + lVar8);
      ConvertOptionsInternal
                (*(Message **)((long)&pEVar1->type_ + lVar8 + 4),
                 (RepeatedPtrField<google::protobuf::Option> *)((long)pvVar4 + 0x10));
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x30;
    } while (lVar7 < descriptor->value_count_);
  }
  ConvertOptionsInternal(&descriptor->options_->super_Message,&(enum_type->field_0)._impl_.options_)
  ;
  return;
}

Assistant:

void ConvertEnumDescriptor(const EnumDescriptor& descriptor, Enum* enum_type) {
  enum_type->Clear();
  enum_type->set_syntax(
      ConvertSyntax(FileDescriptorLegacy(descriptor.file()).edition()));

  enum_type->set_name(descriptor.full_name());
  enum_type->mutable_source_context()->set_file_name(descriptor.file()->name());
  for (int i = 0; i < descriptor.value_count(); ++i) {
    const EnumValueDescriptor& value_descriptor = *descriptor.value(i);
    EnumValue* value = enum_type->mutable_enumvalue()->Add();
    value->set_name(value_descriptor.name());
    value->set_number(value_descriptor.number());

    ConvertEnumValueOptions(value_descriptor.options(),
                            *value->mutable_options());
  }

  ConvertEnumOptions(descriptor.options(), *enum_type->mutable_options());
}